

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<DataStream,transaction_identifier<false>,unsigned_int>
               (DataStream *os,pair<transaction_identifier<false>,_unsigned_int> *item)

{
  long lVar1;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,_transaction_identifier<false>_>
            (in_RSI,(transaction_identifier<false> *)0x17a383d);
  Serialize<DataStream>(in_RSI,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::pair<K, T>& item)
{
    Serialize(os, item.first);
    Serialize(os, item.second);
}